

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# current_transaction_id.cpp
# Opt level: O3

ScalarFunction * duckdb::CurrentTransactionId::GetFunction(void)

{
  LogicalType varargs;
  ScalarFunction *in_RDI;
  undefined4 in_stack_ffffffffffffff64;
  undefined4 in_stack_ffffffffffffff6c;
  undefined1 null_handling;
  undefined8 bind_lambda;
  vector<duckdb::LogicalType,_true> local_68;
  LogicalType local_48;
  LogicalType local_30;
  
  local_68.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  LogicalType::LogicalType(&local_48,UBIGINT);
  bind_lambda = (bind_lambda_function_t)0x0;
  null_handling = 0x8a;
  LogicalType::LogicalType(&local_30,INVALID);
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_4_ = 1;
  varargs._0_8_ = &local_30;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._4_4_ = in_stack_ffffffffffffff64;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = 0;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = in_stack_ffffffffffffff6c;
  ScalarFunction::ScalarFunction
            (in_RDI,&local_68,&local_48,(scalar_function_t *)&stack0xffffffffffffff78,
             CurrentTransactionIdBind,(bind_scalar_function_extended_t)0x0,
             (function_statistics_t)0x0,(init_local_state_t)0x0,varargs,CONSISTENT,null_handling,
             (bind_lambda_function_t)bind_lambda);
  LogicalType::~LogicalType(&local_30);
  ::std::
  _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
  ::_M_manager((_Any_data *)&stack0xffffffffffffff78,(_Any_data *)&stack0xffffffffffffff78,
               __destroy_functor);
  LogicalType::~LogicalType(&local_48);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_68);
  return in_RDI;
}

Assistant:

ScalarFunction CurrentTransactionId::GetFunction() {
	return ScalarFunction({}, LogicalType::UBIGINT, CurrentTransactionIdFunction, CurrentTransactionIdBind, nullptr,
	                      nullptr, nullptr, LogicalType(LogicalTypeId::INVALID), FunctionStability::VOLATILE);
}